

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall wasm::BranchUtils::getBranchTargets::Scanner::~Scanner(Scanner *this)

{
  Scanner *this_local;
  
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set(&this->targets);
  PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::~PostWalker
            (&this->super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>);
  return;
}

Assistant:

inline NameSet getBranchTargets(Expression* ast) {
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    NameSet targets;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          targets.insert(name);
        }
      });
    }
  };
  Scanner scanner;
  scanner.walk(ast);
  return scanner.targets;
}